

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

int run_test_fs_poll(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  remove("testfile");
  iVar1 = uv_timer_init(::loop,&timer_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x9e,"0 == uv_timer_init(loop, &timer_handle)");
    abort();
  }
  iVar1 = uv_fs_poll_init(::loop,&poll_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0x9f,"0 == uv_fs_poll_init(loop, &poll_handle)");
    abort();
  }
  iVar1 = uv_fs_poll_start(&poll_handle,poll_cb,"testfile",100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa0,"0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100)");
    abort();
  }
  iVar1 = uv_run(::loop,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa1,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (poll_cb_called != 5) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa3,"poll_cb_called == 5");
    abort();
  }
  if (timer_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa4,"timer_cb_called == 2");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa5,"close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
            ,0xa7,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_poll) {
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_fs_poll_init(loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(poll_cb_called == 5);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}